

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::dht_tracker::incoming_packet
          (dht_tracker *this,listen_socket_handle *s,endpoint *ep,span<const_char> buf)

{
  counters *this_00;
  bool bVar1;
  int iVar2;
  type_t tVar3;
  index_type iVar4;
  char *pcVar5;
  uchar *puVar6;
  uchar *puVar7;
  reference __val;
  time_point now;
  char *pcVar8;
  reference ppVar9;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  msg m;
  undefined1 local_a8 [4];
  int ret;
  error_code err;
  int pos;
  address local_88;
  address local_68;
  undefined1 local_44 [12];
  bytes_type b;
  int buf_size;
  endpoint *ep_local;
  listen_socket_handle *s_local;
  dht_tracker *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (dht_tracker *)buf.m_ptr;
  _b = ep;
  iVar4 = span<const_char>::size((span<const_char> *)&this_local);
  local_44._8_4_ = (undefined4)iVar4;
  if ((((int)local_44._8_4_ < 0x15) ||
      (pcVar5 = span<const_char>::front((span<const_char> *)&this_local), *pcVar5 != 'd')) ||
     (pcVar5 = span<const_char>::back((span<const_char> *)&this_local), *pcVar5 != 'e')) {
    buf_local.m_len._7_1_ = false;
  }
  else {
    counters::inc_stats_counter(this->m_counters,0x8c,(long)(int)local_44._8_4_);
    this_00 = this->m_counters;
    bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                      ((basic_endpoint<boost::asio::ip::udp> *)_b);
    iVar2 = 0x1c;
    if (bVar1) {
      iVar2 = 0x30;
    }
    counters::inc_stats_counter(this_00,0x84,(long)iVar2);
    counters::inc_stats_counter(this->m_counters,0x88,1);
    if ((((this->m_settings->super_dht_settings).ignore_dark_internet & 1U) != 0) &&
       (bVar1 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                          ((basic_endpoint<boost::asio::ip::udp> *)_b), bVar1)) {
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
                (&local_68,(basic_endpoint<boost::asio::ip::udp> *)_b);
      boost::asio::ip::address::to_v4((address *)local_44);
      local_44._4_4_ = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_44);
      puVar6 = std::begin<unsigned_char_const,17ul>
                         ((uchar (*) [17])"\x03\x06\a\t\v\x13\x15\x16\x19\x1a\x1c\x1d\x1e!\"08");
      puVar7 = std::end<unsigned_char_const,17ul>
                         ((uchar (*) [17])"\x03\x06\a\t\v\x13\x15\x16\x19\x1a\x1c\x1d\x1e!\"08");
      __val = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)(local_44 + 4),0);
      puVar6 = std::find<unsigned_char_const*,unsigned_char>(puVar6,puVar7,__val);
      puVar7 = std::end<unsigned_char_const,17ul>
                         ((uchar (*) [17])"\x03\x06\a\t\v\x13\x15\x16\x19\x1a\x1c\x1d\x1e!\"08");
      if (puVar6 != puVar7) {
        counters::inc_stats_counter(this->m_counters,0x89,1);
        return true;
      }
    }
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
              (&local_88,(basic_endpoint<boost::asio::ip::udp> *)_b);
    now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    bVar1 = dos_blocker::incoming(&this->m_blocker,&local_88,now,&this->m_log->super_dht_logger);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      boost::system::error_code::error_code((error_code *)local_a8);
      pcVar5 = span<const_char>::data((span<const_char> *)&this_local);
      pcVar8 = span<const_char>::data((span<const_char> *)&this_local);
      iVar2 = bdecode(pcVar5,pcVar8 + (int)local_44._8_4_,&this->m_msg,(error_code *)local_a8,
                      (int *)((long)&err.cat_ + 4),10,500);
      if (iVar2 == 0) {
        tVar3 = bdecode_node::type(&this->m_msg);
        if (tVar3 == dict_t) {
          m._32_8_ = this_local;
          (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])
                    (this->m_log,0,this_local,buf_local.m_ptr,_b);
          dht::msg::msg((msg *)&__range2,&this->m_msg,(endpoint *)_b);
          __end2 = std::
                   map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
                   ::begin(&this->m_nodes);
          n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
               *)std::
                 map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
                 ::end(&this->m_nodes);
          while (bVar1 = std::operator!=(&__end2,(_Self *)&n), bVar1) {
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
                     ::operator*(&__end2);
            dht::node::incoming(&(ppVar9->second).dht,s,(msg *)&__range2);
            std::
            _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
            ::operator++(&__end2);
          }
          buf_local.m_len._7_1_ = true;
        }
        else {
          counters::inc_stats_counter(this->m_counters,0x89,1);
          (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])
                    (this->m_log,0,this_local,buf_local.m_ptr,_b);
          buf_local.m_len._7_1_ = false;
        }
      }
      else {
        counters::inc_stats_counter(this->m_counters,0x89,1);
        (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])
                  (this->m_log,0,this_local,buf_local.m_ptr,_b);
        buf_local.m_len._7_1_ = false;
      }
    }
    else {
      counters::inc_stats_counter(this->m_counters,0x89,1);
      buf_local.m_len._7_1_ = true;
    }
  }
  return buf_local.m_len._7_1_;
}

Assistant:

bool dht_tracker::incoming_packet(aux::listen_socket_handle const& s
		, udp::endpoint const& ep, span<char const> const buf)
	{
		int const buf_size = int(buf.size());
		if (buf_size <= 20
			|| buf.front() != 'd'
			|| buf.back() != 'e') return false;

		m_counters.inc_stats_counter(counters::dht_bytes_in, buf_size);
		// account for IP and UDP overhead
		m_counters.inc_stats_counter(counters::recv_ip_overhead_bytes
			, is_v6(ep) ? 48 : 28);
		m_counters.inc_stats_counter(counters::dht_messages_in);

		if (m_settings.ignore_dark_internet && is_v4(ep))
		{
			address_v4::bytes_type b = ep.address().to_v4().to_bytes();

			// these are class A networks not available to the public
			// if we receive messages from here, that seems suspicious
			static std::uint8_t const class_a[] = { 3, 6, 7, 9, 11, 19, 21, 22, 25
				, 26, 28, 29, 30, 33, 34, 48, 56 };

			if (std::find(std::begin(class_a), std::end(class_a), b[0]) != std::end(class_a))
			{
				m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
				return true;
			}
		}

		if (!m_blocker.incoming(ep.address(), clock_type::now(), m_log))
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
			return true;
		}

		TORRENT_ASSERT(buf_size > 0);

		int pos;
		error_code err;
		int const ret = bdecode(buf.data(), buf.data() + buf_size, m_msg, err, &pos, 10, 500);
		if (ret != 0)
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif
			return false;
		}

		if (m_msg.type() != bdecode_node::dict_t)
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif
			// it's not a good idea to send a response to an invalid messages
			return false;
		}

#ifndef TORRENT_DISABLE_LOGGING
		m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif

		libtorrent::dht::msg const m(m_msg, ep);
		for (auto& n : m_nodes)
			n.second.dht.incoming(s, m);
		return true;
	}